

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O3

Gia_Man_t * Gia_ManDupIn2Ff(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Gia_Man_t *p_01;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  
  iVar17 = p->vCis->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar5 = iVar17;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar6;
  p_01 = Gia_ManStart(iVar17 * 2 + p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_01->pName = pcVar8;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_01->pSpec = pcVar8;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  pVVar11 = p->vCis;
  iVar17 = pVVar11->nSize;
  if (iVar5 < iVar17) {
    lVar15 = 0;
    do {
      if (iVar17 <= lVar15) goto LAB_00621f65;
      if ((pVVar11->pArray[lVar15] < 0) || (p->nObjs <= pVVar11->pArray[lVar15])) goto LAB_00621f27;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar13 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_01->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar9)) goto LAB_00621f46;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_01->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar9)) goto LAB_00621f46;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556);
      lVar15 = lVar15 + 1;
      iVar5 = p->nRegs;
      pVVar11 = p->vCis;
      iVar17 = pVVar11->nSize;
    } while (lVar15 < iVar17 - iVar5);
  }
  if (0 < iVar5) {
    iVar17 = 0;
    do {
      pVVar11 = p->vCis;
      uVar12 = (pVVar11->nSize - iVar5) + iVar17;
      if (((int)uVar12 < 0) || (pVVar11->nSize <= (int)uVar12)) goto LAB_00621f65;
      iVar1 = pVVar11->pArray[uVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00621f27;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_00621b84;
      pGVar10 = Gia_ManAppendObj(p_01);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_01->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_01->nObjs <= pGVar10)) goto LAB_00621f46;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_01->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_01->nObjs <= pGVar10)) goto LAB_00621f46;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * 0x55555556;
      iVar17 = iVar17 + 1;
      iVar5 = p->nRegs;
    } while (iVar17 < iVar5);
    pVVar11 = p->vCis;
  }
LAB_00621b84:
  iVar17 = pVVar11->nSize;
  if (iVar5 < iVar17) {
    lVar15 = 0;
    do {
      if (iVar17 <= lVar15) goto LAB_00621f65;
      iVar17 = pVVar11->pArray[lVar15];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00621f27;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_01);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_01->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_01->nObjs <= pGVar10)) {
LAB_00621f46:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_01->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_01->nObjs <= pGVar10)) goto LAB_00621f46;
      pGVar4[iVar17].Value = (int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      iVar5 = p->nRegs;
      pVVar11 = p->vCis;
      iVar17 = pVVar11->nSize;
    } while (lVar15 < iVar17 - iVar5);
  }
  iVar17 = p->nObjs;
  if (0 < iVar17) {
    lVar15 = 8;
    lVar16 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar4 + lVar15 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar12 = *(uint *)((long)pGVar4 +
                          lVar15 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar15 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_00621f84;
        iVar5 = Gia_ManAppendAnd(p_01,uVar12 ^ (uint)(uVar13 >> 0x1d) & 1,
                                 uVar2 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar15) = iVar5;
        iVar17 = p->nObjs;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < iVar17);
    iVar5 = p->nRegs;
  }
  pVVar11 = p->vCos;
  iVar17 = pVVar11->nSize;
  if (iVar5 < iVar17) {
    lVar15 = 0;
    do {
      if (iVar17 <= lVar15) goto LAB_00621f65;
      iVar17 = pVVar11->pArray[lVar15];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00621f27;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar17;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
      goto LAB_00621f84;
      uVar12 = Gia_ManAppendCo(p_01,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                    pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value
                              );
      pGVar4->Value = uVar12;
      lVar15 = lVar15 + 1;
      iVar5 = p->nRegs;
      pVVar11 = p->vCos;
      iVar17 = pVVar11->nSize;
    } while (lVar15 < iVar17 - iVar5);
  }
  if (0 < iVar5) {
    iVar17 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar12 = (iVar1 - iVar5) + iVar17;
      if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_00621f65;
      iVar1 = p->vCos->pArray[uVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00621f27;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_00621f84:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_01,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                    pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value
                              );
      pGVar4->Value = uVar12;
      iVar17 = iVar17 + 1;
      iVar5 = p->nRegs;
    } while (iVar17 < iVar5);
  }
  pVVar11 = p->vCis;
  uVar12 = pVVar11->nSize;
  uVar13 = (ulong)uVar12;
  uVar14 = (ulong)(uVar12 - iVar5);
  if (uVar12 - iVar5 != 0 && iVar5 <= (int)uVar12) {
    lVar15 = 0;
    do {
      if ((int)uVar13 <= lVar15) {
LAB_00621f65:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar11->pArray[lVar15] < 0) || (p->nObjs <= pVVar11->pArray[lVar15])) {
LAB_00621f27:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= lVar15) goto LAB_00621f65;
      Gia_ManAppendCo(p_01,p_00->pArray[lVar15]);
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCis;
      uVar13 = (ulong)pVVar11->nSize;
      uVar14 = uVar13 - (long)p->nRegs;
    } while (lVar15 < (long)uVar14);
  }
  Gia_ManSetRegNum(p_01,(int)uVar14);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return p_01;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Specialized duplication.]

  Description [Replaces registers by PIs/POs and PIs by registers.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDupIn2Ff( Gia_Man_t * p )
{
    Vec_Int_t * vPiOuts;
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    vPiOuts = Vec_IntAlloc( Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2 * Gia_ManPiNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPiOuts, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ManAppendCo( pNew, Vec_IntEntry(vPiOuts, i) );
    Gia_ManSetRegNum( pNew, Gia_ManPiNum(p) );
    Vec_IntFree( vPiOuts );
    return pNew;
}